

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_xml_ExpatError.cpp
# Opt level: O0

ErrorHdr * __thiscall axl::xml::ExpatError::create(ExpatError *this,XML_Error code)

{
  uint32_t in_ESI;
  ErrorHdr *error;
  bool in_stack_0000004f;
  size_t in_stack_00000050;
  Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef> *in_stack_00000058;
  ErrorHdr *local_8;
  
  local_8 = rc::Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>::createBuffer
                      (in_stack_00000058,in_stack_00000050,in_stack_0000004f);
  if (local_8 == (ErrorHdr *)0x0) {
    local_8 = (ErrorHdr *)0x0;
  }
  else {
    local_8->m_size = 0x18;
    *(undefined8 *)&(local_8->m_guid).field_0 = 0x4ec164f7034b6d20;
    *(undefined8 *)((long)&(local_8->m_guid).field_0 + 8) = 0x65876c143fb25f8c;
    local_8->m_code = in_ESI;
  }
  return local_8;
}

Assistant:

err::ErrorHdr*
ExpatError::create(XML_Error code) {
	err::ErrorHdr* error = createBuffer(sizeof(err::ErrorHdr));
	if (!error)
		return NULL;

	error->m_size = sizeof(err::ErrorHdr);
	error->m_guid = g_expatErrorGuid;
	error->m_code = code;
	return error;
}